

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn)

{
  uint uVar1;
  u16 *puVar2;
  double dVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  WhereClause *pWVar7;
  sqlite3_index_constraint_usage *__s;
  WhereLoop *pWVar8;
  Parse *pParse;
  SrcList *pSVar9;
  WhereTerm *pWVar10;
  sqlite3_vtab *psVar11;
  sqlite3 *psVar12;
  i8 iVar13;
  u16 uVar14;
  short sVar15;
  LogEst LVar16;
  uint uVar17;
  int iVar18;
  uchar *puVar19;
  VTable *pVVar20;
  long lVar21;
  ushort uVar22;
  char *pcVar23;
  int iVar24;
  long lVar25;
  
  pWVar7 = pBuilder->pWC;
  __s = pIdxInfo->aConstraintUsage;
  pWVar8 = pBuilder->pNew;
  pParse = pBuilder->pWInfo->pParse;
  pSVar9 = pBuilder->pWInfo->pTabList;
  bVar4 = pWVar8->iTab;
  iVar18 = pIdxInfo->nConstraint;
  lVar25 = (long)iVar18;
  *pbIn = 0;
  pWVar8->prereq = mPrereq;
  if (0 < lVar25) {
    pWVar10 = pWVar7->a;
    puVar19 = &pIdxInfo->aConstraint->usable;
    iVar24 = iVar18;
    do {
      *puVar19 = '\0';
      if (((pWVar10[*(int *)(puVar19 + 3)].prereqRight & ~mUsable) == 0) &&
         ((pWVar10[*(int *)(puVar19 + 3)].eOperator & mExclude) == 0)) {
        *puVar19 = '\x01';
      }
      puVar19 = puVar19 + 0xc;
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
  }
  memset(__s,0,lVar25 * 8);
  pIdxInfo->idxStr = (char *)0x0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = 5e+98;
  pIdxInfo->estimatedRows = 0x19;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = pSVar9->a[bVar4].colUsed;
  for (pVVar20 = (pSVar9->a[bVar4].pTab)->pVTable; pVVar20->db != pParse->db;
      pVVar20 = pVVar20->pNext) {
  }
  psVar11 = pVVar20->pVtab;
  uVar17 = (*psVar11->pModule->xBestIndex)(psVar11,pIdxInfo);
  if (uVar17 != 0) {
    if (uVar17 == 7) {
      psVar12 = pParse->db;
      if ((psVar12->mallocFailed == '\0') && (psVar12->bBenignMalloc == '\0')) {
        psVar12->mallocFailed = '\x01';
        if (0 < psVar12->nVdbeExec) {
          (psVar12->u1).isInterrupted = 1;
        }
        (psVar12->lookaside).bDisable = (psVar12->lookaside).bDisable + 1;
      }
    }
    else {
      pcVar23 = psVar11->zErrMsg;
      if (pcVar23 == (char *)0x0) {
        if (uVar17 == 0x204) {
          pcVar23 = "abort due to ROLLBACK";
        }
        else {
          uVar17 = uVar17 & 0xff;
          pcVar23 = "unknown error";
          if ((uVar17 < 0x1b) && ((0x1410004UL >> ((ulong)uVar17 & 0x3f) & 1) == 0)) {
            pcVar23 = *(char **)(sqlite3ErrStr_aMsg + (ulong)uVar17 * 8);
          }
        }
      }
      sqlite3ErrorMsg(pParse,"%s",pcVar23);
    }
  }
  sqlite3_free(psVar11->zErrMsg);
  psVar11->zErrMsg = (char *)0x0;
  if (pParse->nErr != 0) {
    return pParse->nErr;
  }
  if (0 < iVar18) {
    lVar21 = 0;
    do {
      pWVar8->aLTerm[lVar21] = (WhereTerm *)0x0;
      lVar21 = lVar21 + 1;
    } while (lVar25 != lVar21);
    (pWVar8->u).btree.nIdxCol = 0;
    if (0 < iVar18) {
      puVar19 = &pIdxInfo->aConstraint->usable;
      uVar17 = 0xffffffff;
      lVar21 = 0;
      do {
        uVar5 = __s[lVar21].argvIndex;
        if (0 < (int)uVar5) {
          if (iVar18 < (int)uVar5) {
code_r0x00248092:
            sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(pSVar9->a[bVar4].pTab)->zName);
            return 1;
          }
          uVar6 = *(uint *)(puVar19 + 3);
          if (((int)uVar6 < 0) || (pWVar7->nTerm <= (int)uVar6)) goto code_r0x00248092;
          uVar1 = uVar5 - 1;
          if ((pWVar8->aLTerm[uVar1] != (WhereTerm *)0x0) || (*puVar19 == '\0'))
          goto code_r0x00248092;
          pWVar10 = pWVar7->a + uVar6;
          pWVar8->prereq = pWVar8->prereq | pWVar7->a[uVar6].prereqRight;
          pWVar8->aLTerm[uVar1] = pWVar10;
          if ((int)uVar17 < (int)uVar1) {
            uVar17 = uVar1;
          }
          if ((uVar5 < 0x11) && (__s[lVar21].omit != '\0')) {
            puVar2 = &(pWVar8->u).btree.nIdxCol;
            *puVar2 = *puVar2 | (ushort)(1 << ((byte)uVar1 & 0x1f));
          }
          if ((pWVar10->eOperator & 1) != 0) {
            pIdxInfo->orderByConsumed = 0;
            *(byte *)&pIdxInfo->idxFlags = (byte)pIdxInfo->idxFlags & 0xfe;
            *pbIn = 1;
          }
        }
        lVar21 = lVar21 + 1;
        puVar19 = puVar19 + 0xc;
      } while (lVar25 != lVar21);
      uVar22 = (pWVar8->u).btree.nIdxCol;
      uVar14 = (short)uVar17 + 1;
      goto LAB_00248316;
    }
  }
  uVar22 = 0;
  uVar14 = 0;
LAB_00248316:
  (pWVar8->u).btree.nIdxCol = uVar22 & ~mNoOmit;
  pWVar8->nLTerm = uVar14;
  (pWVar8->u).vtab.idxNum = pIdxInfo->idxNum;
  (pWVar8->u).vtab.needFree = (u8)pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  (pWVar8->u).btree.pIndex = (Index *)pIdxInfo->idxStr;
  if (pIdxInfo->orderByConsumed == 0) {
    iVar13 = '\0';
  }
  else {
    iVar13 = (i8)pIdxInfo->nOrderBy;
  }
  (pWVar8->u).vtab.isOrdered = iVar13;
  pWVar8->rSetup = 0;
  dVar3 = pIdxInfo->estimatedCost;
  if (dVar3 <= 1.0) {
    sVar15 = 0;
  }
  else if (dVar3 <= 2000000000.0) {
    sVar15 = sqlite3LogEst((long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3
                          );
  }
  else {
    sVar15 = (ushort)((ulong)dVar3 >> 0x34) * 10 + -0x27ec;
  }
  pWVar8->rRun = sVar15;
  LVar16 = sqlite3LogEst(pIdxInfo->estimatedRows);
  pWVar8->nOut = LVar16;
  pWVar8->wsFlags = (pIdxInfo->idxFlags & 1U) << 0xc | pWVar8->wsFlags & 0xffffefff;
  iVar18 = whereLoopInsert((WhereLoopBuilder *)pBuilder->pWInfo,(WhereLoop *)pBuilder->pOrSet);
  if ((pWVar8->u).vtab.needFree != '\0') {
    sqlite3_free((pWVar8->u).btree.pIndex);
    (pWVar8->u).vtab.needFree = '\0';
  }
  return iVar18;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn                       /* OUT: True if plan uses an IN(...) op */
){
  WhereClause *pWC = pBuilder->pWC;
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  struct SrcList_item *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by 
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = &pWC->a[pIdxCons->iTermOffset];
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight 
     && (pTerm->eOperator & mExclude)==0
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = (sqlite3_int64)pSrc->colUsed;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pTab, pIdxInfo);
  if( rc ) return rc;

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  for(i=0; i<nConstraint; i++) pNew->aLTerm[i] = 0;
  pNew->u.vtab.omitMask = 0;
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || j>=pWC->nTerm
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        rc = SQLITE_ERROR;
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
        return rc;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pTerm = &pWC->a[j];
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( iTerm<16 && pUsage[i].omit ) pNew->u.vtab.omitMask |= 1<<iTerm;
      if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }
    }
  }
  pNew->u.vtab.omitMask &= ~mNoOmit;

  pNew->nLTerm = mxTerm+1;
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}